

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
DMessageBoxMenu::DMessageBoxMenu
          (DMessageBoxMenu *this,DMenu *parent,char *message,int messagemode,bool playsound,
          FName *action)

{
  FFont *pFVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int mr2;
  int mr1;
  FName *action_local;
  bool playsound_local;
  int messagemode_local;
  char *message_local;
  DMenu *parent_local;
  DMessageBoxMenu *this_local;
  
  DMenu::DMenu(&this->super_DMenu,parent);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b638b8;
  FName::FName(&this->mAction);
  FName::operator=(&this->mAction,action);
  this->messageSelection = 0;
  this->mMouseLeft = 0x8c;
  this->mMouseY = -0x80000000;
  pFVar1 = SmallFont;
  pcVar4 = FStringTable::operator[](&GStrings,"TXT_YES");
  iVar2 = FFont::StringWidth(pFVar1,pcVar4);
  pFVar1 = SmallFont;
  pcVar4 = FStringTable::operator[](&GStrings,"TXT_NO");
  iVar3 = FFont::StringWidth(pFVar1,pcVar4);
  iVar2 = MAX<int>(iVar2 + 0xaa,iVar3 + 0xaa);
  this->mMouseRight = iVar2;
  Init(this,parent,message,messagemode,playsound);
  return;
}

Assistant:

DMessageBoxMenu::DMessageBoxMenu(DMenu *parent, const char *message, int messagemode, bool playsound, FName action)
: DMenu(parent)
{
	mAction = action;
	messageSelection = 0;
	mMouseLeft = 140;
	mMouseY = INT_MIN;
	int mr1 = 170 + SmallFont->StringWidth(GStrings["TXT_YES"]);
	int mr2 = 170 + SmallFont->StringWidth(GStrings["TXT_NO"]);
	mMouseRight = MAX(mr1, mr2);

	Init(parent, message, messagemode, playsound);
}